

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall
google::anon_unknown_10::LogFileObject::Write
          (LogFileObject *this,bool force_flush,time_t timestamp,char *message,int message_len)

{
  bool bVar1;
  int iVar2;
  char *__s;
  char *pcVar3;
  int64 iVar4;
  int *piVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  uint32 uVar7;
  pointer pbVar8;
  uint uVar9;
  string module_name;
  MutexLock l;
  string local_78;
  MutexLock local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58.mu_ = &this->lock_;
  if ((this->lock_).is_safe_ == true) {
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_58.mu_);
    if (iVar2 != 0) {
      abort();
    }
  }
  if ((this->base_filename_selected_ == true) && ((this->base_filename_)._M_string_length == 0))
  goto LAB_0011437f;
  uVar9 = 1;
  if (1 < (int)fLI::FLAGS_max_log_size) {
    uVar9 = fLI::FLAGS_max_log_size;
  }
  if (this->file_length_ >> 0x14 < uVar9) {
    bVar1 = glog_internal_namespace_::PidHasChanged();
    if (bVar1) goto LAB_00114101;
  }
  else {
LAB_00114101:
    if ((FILE *)this->file_ != (FILE *)0x0) {
      fclose((FILE *)this->file_);
    }
    this->file_ = (FILE *)0x0;
    this->bytes_since_flush_ = 0;
    this->dropped_mem_length_ = 0;
    this->file_length_ = 0;
    this->rollover_attempt_ = 0x1f;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"etc","");
  __s = strchr(message,0x5b);
  if (__s != (char *)0x0) {
    pcVar3 = strchr(__s,0x20);
    if (pcVar3 != (char *)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s + 1,pcVar3);
      std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  }
  if (this->file_ == (FILE *)0x0) {
    uVar9 = this->rollover_attempt_ + 1;
    this->rollover_attempt_ = uVar9;
    if (uVar9 == 0x20) {
      this->rollover_attempt_ = 0;
      if (this->base_filename_selected_ == true) {
        bVar1 = CreateLogfile(this,&local_78);
        if (bVar1) goto LAB_001141c5;
        _GLOBAL__N_1::LogFileObject::Write();
      }
      else {
        pvVar6 = GetLoggingDirectories_abi_cxx11_();
        pbVar8 = (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar8 != (pvVar6->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          do {
            bVar1 = CreateLogfile(this,&local_78);
            if (bVar1) goto LAB_001141c5;
            pbVar8 = pbVar8 + 1;
          } while (pbVar8 != (pvVar6->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        }
        _GLOBAL__N_1::LogFileObject::Write((LogFileObject *)&local_78);
      }
    }
  }
  else {
LAB_001141c5:
    if (stop_writing == '\0') {
      piVar5 = __errno_location();
      *piVar5 = 0;
      fwrite(message,1,(long)message_len,(FILE *)this->file_);
      if ((fLB::FLAGS_stop_logging_if_full_disk == '\x01') && (*piVar5 == 0x1c)) {
        stop_writing = '\x01';
      }
      else {
        this->file_length_ = this->file_length_ + message_len;
        uVar9 = message_len + this->bytes_since_flush_;
        this->bytes_since_flush_ = uVar9;
        if (uVar9 < 1000000 && !force_flush) {
          iVar4 = glog_internal_namespace_::CycleClock_Now();
          if (iVar4 < this->next_flush_time_) goto LAB_00114363;
        }
        FlushUnlocked(this);
        if ((fLB::FLAGS_drop_log_memory == '\x01') && (0x2fffff < this->file_length_)) {
          uVar7 = (this->file_length_ & 0xfff00000) - 0x100000;
          uVar9 = uVar7 - this->dropped_mem_length_;
          if (0x1fffff < uVar9) {
            iVar2 = fileno((FILE *)this->file_);
            posix_fadvise(iVar2,(ulong)this->dropped_mem_length_,(ulong)uVar9,4);
            this->dropped_mem_length_ = uVar7;
          }
        }
      }
    }
    else {
      iVar4 = glog_internal_namespace_::CycleClock_Now();
      if (this->next_flush_time_ <= iVar4) {
        stop_writing = '\0';
      }
    }
  }
LAB_00114363:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_0011437f:
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_58);
  return;
}

Assistant:

void LogFileObject::Write(bool force_flush,
                          time_t timestamp,
                          const char* message,
                          int message_len) {
  MutexLock l(&lock_);

  // We don't log if the base_name_ is "" (which means "don't write")
  if (base_filename_selected_ && base_filename_.empty()) {
    return;
  }

  if (static_cast<int>(file_length_ >> 20) >= MaxLogSize() ||
      PidHasChanged()) {
    if (file_ != NULL) fclose(file_);
    file_ = NULL;
    file_length_ = bytes_since_flush_ = dropped_mem_length_ = 0;
    rollover_attempt_ = kRolloverAttemptFrequency-1;
  }

  // @huihut: default module name & length
  size_t module_len = 3;
  string module_name = "etc";
  
  // @huihut: get the module name from the log message
  const char *ret_left, *ret_right;
  ret_left = strchr(message, '[');
  if(ret_left != NULL)
  {
    ret_right = strchr(ret_left, ' ');
    if(ret_right != NULL)
    {
      module_len =  ret_right - (ret_left + 1);
      module_name = string((ret_left + 1), module_len);
    }
  }

  // If there's no destination file, make one before outputting
  if (file_ == NULL) {
    // Try to rollover the log file every 32 log messages.  The only time
    // this could matter would be when we have trouble creating the log
    // file.  If that happens, we'll lose lots of log messages, of course!
    if (++rollover_attempt_ != kRolloverAttemptFrequency) return;
    rollover_attempt_ = 0;

    // @huihut Use only the 'module_name' as the log file name
    // struct ::tm tm_time;
    // localtime_r(&timestamp, &tm_time);

    // // The logfile's filename will have the date/time & pid in it
    // ostringstream time_pid_stream;
    // time_pid_stream.fill('0');
    // time_pid_stream << 1900+tm_time.tm_year
    //                 << setw(2) << 1+tm_time.tm_mon
    //                 << setw(2) << tm_time.tm_mday
    //                 << '-'
    //                 << setw(2) << tm_time.tm_hour
    //                 << setw(2) << tm_time.tm_min
    //                 << setw(2) << tm_time.tm_sec
    //                 << '.'
    //                 << GetMainThreadPid();
    // const string& time_pid_string = time_pid_stream.str();

    // @huihut: Warning: use the 'time_pid_string' storage 'module_name'
    const string& time_pid_string = module_name;

    if (base_filename_selected_) {
      if (!CreateLogfile(time_pid_string)) {
        perror("Could not create log file");
        fprintf(stderr, "COULD NOT CREATE LOGFILE '%s'!\n",
                time_pid_string.c_str());
        return;
      }
    } else {
      // If no base filename for logs of this severity has been set, use a
      // default base filename of
      // "<program name>.<hostname>.<user name>.log.<severity level>.".  So
      // logfiles will have names like
      // webserver.examplehost.root.log.INFO.19990817-150000.4354, where
      // 19990817 is a date (1999 August 17), 150000 is a time (15:00:00),
      // and 4354 is the pid of the logging process.  The date & time reflect
      // when the file was created for output.
      //
      // Where does the file get put?  Successively try the directories
      // "/tmp", and "."

      // @huihut Does not generate unwanted log files
      // string stripped_filename(
      //     glog_internal_namespace_::ProgramInvocationShortName());
      // string hostname;
      // GetHostName(&hostname);

      // string uidname = MyUserName();

      // We should not call CHECK() here because this function can be
      // called after holding on to log_mutex. We don't want to
      // attempt to hold on to the same mutex, and get into a
      // deadlock. Simply use a name like invalid-user.

      // if (uidname.empty()) uidname = "invalid-user";

      // stripped_filename = stripped_filename+'.'+hostname+'.'
      //                     +uidname+".log."
      //                     +LogSeverityNames[severity_]+'.';
      // We're going to (potentially) try to put logs in several different dirs
      const vector<string> & log_dirs = GetLoggingDirectories();

      // Go through the list of dirs, and try to create the log file in each
      // until we succeed or run out of options
      bool success = false;
      for (vector<string>::const_iterator dir = log_dirs.begin();
           dir != log_dirs.end();
           ++dir) {
        // base_filename_ = *dir + "/" + stripped_filename;
        if ( CreateLogfile(time_pid_string) ) {
          success = true;
          break;
        }
      }
      // If we never succeeded, we have to give up
      if ( success == false ) {
        perror("Could not create logging file");
        fprintf(stderr, "COULD NOT CREATE A LOGGINGFILE %s!",
                time_pid_string.c_str());
        return;
      }
    }

    // @huihut delete file_header
    // // Write a header message into the log file
    // ostringstream file_header_stream;
    // file_header_stream.fill('0');
    // file_header_stream << "Log file created at: "
    //                    << 1900+tm_time.tm_year << '/'
    //                    << setw(2) << 1+tm_time.tm_mon << '/'
    //                    << setw(2) << tm_time.tm_mday
    //                    << ' '
    //                    << setw(2) << tm_time.tm_hour << ':'
    //                    << setw(2) << tm_time.tm_min << ':'
    //                    << setw(2) << tm_time.tm_sec << '\n'
    //                    << "Running on machine: "
    //                    << LogDestination::hostname() << '\n'
    //                    << "Log line format: [IWEF]mmdd hh:mm:ss.uuuuuu "
    //                    << "threadid file:line] msg" << '\n';
    // const string& file_header_string = file_header_stream.str();

    // const int header_len = file_header_string.size();
    // fwrite(file_header_string.data(), 1, header_len, file_);
    // file_length_ += header_len;
    // bytes_since_flush_ += header_len;
  }

  // Write to LOG file
  if ( !stop_writing ) {
    // fwrite() doesn't return an error when the disk is full, for
    // messages that are less than 4096 bytes. When the disk is full,
    // it returns the message length for messages that are less than
    // 4096 bytes. fwrite() returns 4096 for message lengths that are
    // greater than 4096, thereby indicating an error.
    errno = 0;
    fwrite(message, 1, message_len, file_);
    if ( FLAGS_stop_logging_if_full_disk &&
         errno == ENOSPC ) {  // disk full, stop writing to disk
      stop_writing = true;  // until the disk is
      return;
    } else {
      file_length_ += message_len;
      bytes_since_flush_ += message_len;
    }
  } else {
    if ( CycleClock_Now() >= next_flush_time_ )
      stop_writing = false;  // check to see if disk has free space.
    return;  // no need to flush
  }

  // See important msgs *now*.  Also, flush logs at least every 10^6 chars,
  // or every "FLAGS_logbufsecs" seconds.
  if ( force_flush ||
       (bytes_since_flush_ >= 1000000) ||
       (CycleClock_Now() >= next_flush_time_) ) {
    FlushUnlocked();
#ifdef OS_LINUX
    // Only consider files >= 3MiB
    if (FLAGS_drop_log_memory && file_length_ >= (3 << 20)) {
      // Don't evict the most recent 1-2MiB so as not to impact a tailer
      // of the log file and to avoid page rounding issue on linux < 4.7
      uint32 total_drop_length = (file_length_ & ~((1 << 20) - 1)) - (1 << 20);
      uint32 this_drop_length = total_drop_length - dropped_mem_length_;
      if (this_drop_length >= (2 << 20)) {
        // Only advise when >= 2MiB to drop
        posix_fadvise(fileno(file_), dropped_mem_length_, this_drop_length,
                      POSIX_FADV_DONTNEED);
        dropped_mem_length_ = total_drop_length;
      }
    }
#endif
  }
}